

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

void filemgr_free_func(hash_elem *h)

{
  filemgr *file;
  char cVar1;
  avl_node *paVar2;
  int iVar3;
  void *ret;
  void *local_20;
  
  cVar1 = *(char *)((long)&h[6].avl.parent + 4);
  LOCK();
  *(undefined1 *)((long)&h[6].avl.parent + 4) = 2;
  UNLOCK();
  if (cVar1 == '\x01') {
    pthread_join((pthread_t)h[6].avl.left,&local_20);
  }
  file = (filemgr *)(h + -10);
  if ((0 < global_config.ncacheblock) && (h[2].avl.left != (avl_node *)0x0)) {
    bcache_remove_dirty_blocks(file);
    bcache_remove_clean_blocks(file);
    bcache_remove_file(file);
    h[2].avl.left = (avl_node *)0x0;
  }
  if (h[5].avl.left != (avl_node *)0x0) {
    (*(code *)h[5].avl.right)(file);
  }
  wal_remove_transaction(file,(fdb_txn *)&h[2].avl.right);
  free(h[4].avl.parent);
  free(h[4].avl.right);
  iVar3 = wal_is_initialized(file);
  if (iVar3 != 0) {
    wal_shutdown(file,(err_log_callback *)0x0);
    wal_destroy(file);
  }
  free(h[-7].avl.parent);
  free(h[-10].avl.parent);
  paVar2 = h[-1].avl.left;
  if (paVar2 != (avl_node *)0x0) {
    free(paVar2);
  }
  free(h[1].avl.right);
  free(h[2].avl.parent);
  pthread_spin_destroy((pthread_spinlock_t *)&h[7].avl.left);
  plock_destroy((plock *)&h[7].avl.right);
  pthread_mutex_destroy((pthread_mutex_t *)(h + 0xb));
  if (sb_ops.release != (_func_fdb_status_filemgr_ptr *)0x0) {
    (*sb_ops.release)(file);
  }
  filemgr_dirty_update_free(file);
  _free_fhandle_idx((avl_tree *)&h[0x14].avl.left);
  pthread_spin_destroy((pthread_spinlock_t *)(h + 0x15));
  paVar2 = h[0x10].avl.right;
  filemgr_clear_stale_list(file);
  filemgr_clear_stale_info_tree(file);
  filemgr_clear_mergetree(file);
  free(paVar2);
  free(h[1].avl.left);
  free(file);
  return;
}

Assistant:

void filemgr_free_func(struct hash_elem *h)
{
    struct filemgr *file = _get_entry(h, struct filemgr, e);

    filemgr_prefetch_status_t prefetch_state =
                              atomic_get_uint8_t(&file->prefetch_status);

    atomic_store_uint8_t(&file->prefetch_status, FILEMGR_PREFETCH_ABORT);
    if (prefetch_state == FILEMGR_PREFETCH_RUNNING) {
        // prefetch thread was running
        void *ret;
        // wait (the thread must have been created..)
        thread_join(file->prefetch_tid, &ret);
    }

    // remove all cached blocks
    if (global_config.ncacheblock > 0 &&
            file->bcache.load(std::memory_order_relaxed)) {
        bcache_remove_dirty_blocks(file);
        bcache_remove_clean_blocks(file);
        bcache_remove_file(file);
        file->bcache.store(NULL, std::memory_order_relaxed);
    }

    if (file->kv_header) {
        // multi KV intance mode & KV header exists
        file->free_kv_header(file);
    }

    // free global transaction
    wal_remove_transaction(file, &file->global_txn);
    free(file->global_txn.items);
    free(file->global_txn.wrapper);

    // destroy WAL
    if (wal_is_initialized(file)) {
        wal_shutdown(file, NULL);
        wal_destroy(file);
    }
    free(file->wal);

#ifdef _LATENCY_STATS
    for (int x = 0; x < FDB_LATENCY_NUM_STATS; ++x) {
        filemgr_destroy_latency_stat(&file->lat_stats[x]);
    }
#endif // _LATENCY_STATS

    // free filename and header
    free(file->filename);
    if (file->header.data) free(file->header.data);

    // free old/new filename if any
    free(file->old_filename);
    free(file->new_filename);

    // destroy locks
    spin_destroy(&file->lock);

#ifdef __FILEMGR_DATA_PARTIAL_LOCK
    plock_destroy(&file->plock);
#elif defined(__FILEMGR_DATA_MUTEX_LOCK)
    int i;
    for (i=0;i<DLOCK_MAX;++i) {
        mutex_destroy(&file->data_mutex[i]);
    }
#else
    int i;
    for (i=0;i<DLOCK_MAX;++i) {
        spin_destroy(&file->data_spinlock[i]);
    }
#endif //__FILEMGR_DATA_PARTIAL_LOCK

    mutex_destroy(&file->writer_lock.mutex);

    // free superblock
    if (sb_ops.release) {
        sb_ops.release(file);
    }

    // free dirty update index
    filemgr_dirty_update_free(file);

    // free fhandle idx
    _free_fhandle_idx(&file->fhandle_idx);
    spin_destroy(&file->fhandle_idx_lock);

    // free file structure
    struct list *stale_list = filemgr_get_stale_list(file);
    filemgr_clear_stale_list(file);
    filemgr_clear_stale_info_tree(file);
    filemgr_clear_mergetree(file);
    free(stale_list);
    free(file->config);
    free(file);
}